

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall
piksel::Graphics::image
          (Graphics *this,Image *img,float dx,float dy,float dWidth,float dHeight,float sx,float sy,
          float sWidth,float sHeight)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  _Elt_pointer pSVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  
  push(this);
  psVar1 = this->stateStack;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  if (pSVar2[-1].shaderIrrelevantState.tint == false) {
    pSVar2[-1].shaderRelevantState.tintColor.field_0.field_0.x = 1.0;
    pSVar2[-1].shaderRelevantState.tintColor.field_0.field_0.y = 1.0;
    pSVar2[-1].shaderRelevantState.tintColor.field_0.field_0.z = 1.0;
    pSVar2[-1].shaderRelevantState.tintColor.field_0.field_0.w = 1.0;
  }
  pSVar2[-1].shaderIrrelevantState.rectMode = pSVar2[-1].shaderIrrelevantState.imageMode;
  (*glad_glActiveTexture)(img->_index % 8 + 0x84c0);
  (*glad_glBindTexture)(0xde1,img->_texture);
  fVar8 = sx / (float)img->width;
  fVar4 = (((float)img->height - sy) - sHeight) / (float)img->height;
  fVar3 = fVar8 * 0.0;
  fVar5 = fVar4 * 0.0;
  fVar6 = fVar5 + fVar3 + 0.0;
  uVar7 = SUB168(ZEXT416(0x3f800000),0);
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.textureMatrix.value[0].field_0 = uVar7;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.textureMatrix.value[0].field_0 + 8) = 0;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.textureMatrix.value[1].field_0 = 0x3f80000000000000
  ;
  *(undefined1 (*) [16])((long)&pSVar2[-1].shaderRelevantState.textureMatrix.value[1].field_0 + 8) =
       (undefined1  [16])0x0;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.textureMatrix.value[2].field_0 + 8) = uVar7;
  *(ulong *)&pSVar2[-1].shaderRelevantState.textureMatrix.value[3].field_0 =
       CONCAT44(fVar3 + fVar4 + 0.0,fVar8 + fVar5 + 0.0);
  *(ulong *)((long)&pSVar2[-1].shaderRelevantState.textureMatrix.value[3].field_0 + 8) =
       CONCAT44(fVar6 + 1.0,fVar6);
  fVar5 = sWidth / (float)img->width;
  fVar6 = sHeight / (float)img->height;
  fVar4 = fVar5 * 0.0;
  fVar3 = fVar6 * 0.0;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.x = fVar5;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.y = fVar4;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.z = fVar4;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.w = fVar4;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.x = fVar3;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.y = fVar6;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.z = fVar3;
  pSVar2[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.w = fVar3;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.textureMatrix.value[2].field_0 = 0;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.textureMatrix.value[2].field_0 + 8) = uVar7;
  pSVar2[-1].shaderRelevantState.textureIndex = (float)(img->_index % 8);
  _rect(this,dx,dy,dWidth,dHeight);
  pop(this);
  return;
}

Assistant:

void Graphics::image(Image& img, float dx, float dy, float dWidth, float dHeight, float sx, float sy, float sWidth, float sHeight) {
    push();
    State& state = peek();
    if (!state.shaderIrrelevantState.tint) {
        state.shaderRelevantState.tintColor = glm::vec4(1.0f);
    }
    state.shaderIrrelevantState.rectMode = state.shaderIrrelevantState.imageMode;
    glActiveTexture(GL_TEXTURE0 + (img._index % 8));
	glBindTexture(GL_TEXTURE_2D, img._texture);
	state.shaderRelevantState.textureMatrix = glm::translate(glm::mat4(1.0f), glm::vec3(sx / img.width, (img.height - sy - sHeight) / img.height, 0.0f));
	state.shaderRelevantState.textureMatrix = glm::scale(state.shaderRelevantState.textureMatrix, glm::vec3(sWidth / img.width, sHeight / img.height, 1.0f));
    // state.shaderRelevantState.textureMatrix = glm::mat4(1.0f); // for debug
    state.shaderRelevantState.textureIndex = img._index % 8;
    _rect(dx, dy, dWidth, dHeight);
    pop();
}